

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uresbund.cpp
# Opt level: O3

UResourceBundle * ures_copyResb_63(UResourceBundle *r,UResourceBundle *original,UErrorCode *status)

{
  uint32_t uVar1;
  uint32_t uVar2;
  bool bVar3;
  
  if (((original != (UResourceBundle *)0x0) && (r != original)) &&
     (*status < U_ILLEGAL_ARGUMENT_ERROR)) {
    if (r == (UResourceBundle *)0x0) {
      r = (UResourceBundle *)uprv_malloc_63(200);
      if (r == (UResourceBundle *)0x0) {
        *status = U_MEMORY_ALLOCATION_ERROR;
        return (UResourceBundle *)0x0;
      }
      bVar3 = true;
    }
    else {
      if (r->fMagic1 == 0x12c9b17) {
        bVar3 = r->fMagic2 == 0x12bb38b;
      }
      else {
        bVar3 = false;
      }
      ures_closeBundle(r,'\0');
    }
    memcpy(r,original,200);
    r->fResPath = (char *)0x0;
    r->fResPathLen = 0;
    if (original->fResPath != (char *)0x0) {
      ures_appendResPath(r,original->fResPath,original->fResPathLen,status);
    }
    uVar1 = 0x12c9b17;
    if (!bVar3) {
      uVar1 = 0;
    }
    uVar2 = 0x12bb38b;
    if (!bVar3) {
      uVar2 = 0;
    }
    r->fMagic1 = uVar1;
    r->fMagic2 = uVar2;
    if (r->fData != (UResourceDataEntry *)0x0) {
      entryIncrease(r->fData);
    }
  }
  return r;
}

Assistant:

UResourceBundle *ures_copyResb(UResourceBundle *r, const UResourceBundle *original, UErrorCode *status) {
    UBool isStackObject;
    if(U_FAILURE(*status) || r == original) {
        return r;
    }
    if(original != NULL) {
        if(r == NULL) {
            isStackObject = FALSE;
            r = (UResourceBundle *)uprv_malloc(sizeof(UResourceBundle));
            /* test for NULL */
            if (r == NULL) {
                *status = U_MEMORY_ALLOCATION_ERROR;
                return NULL;
            }
        } else {
            isStackObject = ures_isStackObject(r);
            ures_closeBundle(r, FALSE);
        }
        uprv_memcpy(r, original, sizeof(UResourceBundle));
        r->fResPath = NULL;
        r->fResPathLen = 0;
        if(original->fResPath) {
            ures_appendResPath(r, original->fResPath, original->fResPathLen, status);
        }
        ures_setIsStackObject(r, isStackObject);
        if(r->fData != NULL) {
            entryIncrease(r->fData);
        }
    }
    return r;
}